

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O3

void deqp::gls::genCompareOp
               (ostringstream *output,char *dstVec4Var,ValueBlock *valueBlock,
               char *nonFloatNamePrefix,char *checkVarName)

{
  int iVar1;
  bool bVar2;
  DataType DVar3;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  pointer pVVar10;
  
  pVVar10 = (valueBlock->outputs).
            super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar1 = (int)output;
  if ((valueBlock->outputs).super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar10) {
    bVar2 = true;
    lVar7 = 0x20;
    uVar9 = 0;
    do {
      if (bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)output,"bool RES = ",0xb);
        bVar2 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)output,"RES = RES && ",0xd);
      }
      DVar3 = glu::getDataTypeScalarType(*(DataType *)((long)pVVar10 + lVar7 + -0x18));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)output,"isOk(",5);
      if (DVar3 == TYPE_FLOAT) {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)output,*(char **)((long)pVVar10 + lVar7 + -8),
                            *(long *)((long)&(pVVar10->type).m_type + lVar7));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ref_",6);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,*(char **)((long)pVVar10 + lVar7 + -8),
                            *(long *)((long)&(pVVar10->type).m_type + lVar7));
        lVar6 = 9;
        pcVar8 = ", 0.05);\n";
      }
      else {
        if (nonFloatNamePrefix == (char *)0x0) {
          std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)output + -0x18));
        }
        else {
          sVar5 = strlen(nonFloatNamePrefix);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)output,nonFloatNamePrefix,sVar5);
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)output,*(char **)((long)pVVar10 + lVar7 + -8),
                            *(long *)((long)&(pVVar10->type).m_type + lVar7));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ref_",6);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,*(char **)((long)pVVar10 + lVar7 + -8),
                            *(long *)((long)&(pVVar10->type).m_type + lVar7));
        lVar6 = 3;
        pcVar8 = ");\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,lVar6);
      uVar9 = uVar9 + 1;
      pVVar10 = (valueBlock->outputs).
                super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x50;
    } while (uVar9 < (ulong)(((long)(valueBlock->outputs).
                                    super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 4)
                            * -0x3333333333333333));
    if (!bVar2) {
      if (dstVec4Var == (char *)0x0) {
        std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)output + -0x18));
      }
      else {
        sVar5 = strlen(dstVec4Var);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)output,dstVec4Var,sVar5);
      }
      pcVar8 = " = vec4(RES, RES, RES, 1.0);\n";
      lVar7 = 0x1d;
      goto LAB_007c6cc3;
    }
  }
  if (dstVec4Var == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)output + -0x18));
  }
  else {
    sVar5 = strlen(dstVec4Var);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)output,dstVec4Var,sVar5);
  }
  pcVar8 = " = vec4(1.0);\n";
  lVar7 = 0xe;
LAB_007c6cc3:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)output,pcVar8,lVar7);
  return;
}

Assistant:

static void genCompareOp (ostringstream& output, const char* dstVec4Var, const ValueBlock& valueBlock, const char* nonFloatNamePrefix, const char* checkVarName)
{
	bool isFirstOutput = true;

	for (size_t ndx = 0; ndx < valueBlock.outputs.size(); ndx++)
	{
		const Value&	val		= valueBlock.outputs[ndx];

		// Check if we're only interested in one variable (then skip if not the right one).
		if (checkVarName && val.name != checkVarName)
			continue;

		// Prefix.
		if (isFirstOutput)
		{
			output << "bool RES = ";
			isFirstOutput = false;
		}
		else
			output << "RES = RES && ";

		// Generate actual comparison.
		if (getDataTypeScalarType(val.type.getBasicType()) == TYPE_FLOAT)
			output << "isOk(" << val.name << ", ref_" << val.name << ", 0.05);\n";
		else
			output << "isOk(" << nonFloatNamePrefix << val.name << ", ref_" << val.name << ");\n";
	}

	if (isFirstOutput)
		output << dstVec4Var << " = vec4(1.0);\n";	// \todo [petri] Should we give warning if not expect-failure case?
	else
		output << dstVec4Var << " = vec4(RES, RES, RES, 1.0);\n";
}